

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O1

void test_linear_hash_create
               (planck_unit_test_t *tc,linear_hash_table_t *linear_hash,ion_key_type_t key_type,
               ion_key_size_t key_size,ion_value_size_t value_size,
               ion_dictionary_size_t dictionary_size)

{
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  
  iVar1 = linear_hash_init(1,dictionary_size,key_type,key_size,value_size,2,0x55,4,linear_hash);
  (linear_hash->super).compare = dictionary_compare_signed_value;
  pVar2 = planck_unit_assert_int_are_equal
                    (tc,0,(int)iVar1,0x3e,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                    );
  if (pVar2 != '\0') {
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(linear_hash->database != (FILE *)0x0),0x3f,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                       ,"condition was false, expected true");
    if (pVar2 != '\0') {
      pVar2 = planck_unit_assert_true
                        (tc,(uint)(linear_hash->state != (FILE *)0x0),0x40,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                         ,"condition was false, expected true");
      if (pVar2 != '\0') {
        pVar2 = planck_unit_assert_true
                          (tc,(uint)(linear_hash->num_buckets == 2),0x41,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                           ,"condition was false, expected true");
        if (pVar2 != '\0') {
          pVar2 = planck_unit_assert_true
                            (tc,(uint)(linear_hash->num_records == 0),0x42,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                             ,"condition was false, expected true");
          if (pVar2 != '\0') {
            pVar2 = planck_unit_assert_true
                              (tc,(uint)(iVar1 == '\0'),0x43,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                               ,"condition was false, expected true");
            if (pVar2 != '\0') {
              return;
            }
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_linear_hash_create(
	planck_unit_test_t		*tc,
	linear_hash_table_t		*linear_hash,
	ion_key_type_t			key_type,
	ion_key_size_t			key_size,
	ion_value_size_t		value_size,
	ion_dictionary_size_t	dictionary_size
) {
	/* TODO create and destroy a linear_hash in every file */

	int			initial_size		= 2;
	int			split_threshold		= 85;
	int			records_per_bucket	= 4;
	ion_err_t	err					= linear_hash_init(1, dictionary_size, key_type, key_size, value_size, initial_size, split_threshold, records_per_bucket, linear_hash);

	linear_hash->super.compare = dictionary_compare_signed_value;

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, err);
	PLANCK_UNIT_ASSERT_TRUE(tc, NULL != linear_hash->database);
	PLANCK_UNIT_ASSERT_TRUE(tc, NULL != linear_hash->state);
	PLANCK_UNIT_ASSERT_TRUE(tc, initial_size == linear_hash->num_buckets);
	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == linear_hash->num_records);
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == err);
}